

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_trait.cpp
# Opt level: O2

void __thiscall
pfederc::Parser::parseTraitBody
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  bool bVar4;
  pointer __p;
  undefined1 local_90 [8];
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> funcExpr;
  Position local_80;
  unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> local_68 [4];
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_48 [3];
  
  local_80.endIndex = (size_t)functions;
  while( true ) {
    bVar4 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    if (!bVar4) {
      return;
    }
    bVar4 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
    if (!bVar4) break;
    bVar4 = Token::operator==(this->lexer->currentToken,TOK_EOL);
    if (bVar4) {
      Lexer::next(this->lexer);
    }
    else {
      parseExpression((Parser *)&local_80.startIndex,(Precedence)this);
      sVar3 = local_80.startIndex;
      if ((FuncExpr *)local_80.startIndex != (FuncExpr *)0x0) {
        if (((Expr *)local_80.startIndex)->type == EXPR_FUNC) {
          local_80.startIndex = 0;
          funcExpr._M_t.
          super___uniq_ptr_impl<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::FuncExpr_*,_std::default_delete<pfederc::FuncExpr>_>.
          super__Head_base<0UL,_pfederc::FuncExpr_*,_false>._M_head_impl =
               (__uniq_ptr_data<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>,_true,_true>
                )(__uniq_ptr_data<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>,_true,_true>
                  )sVar3;
          puVar1 = (((TemplateDecls *)(sVar3 + 0x48))->
                   super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (((TemplateDecls *)(sVar3 + 0x48))->
                   super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (puVar1 != puVar2) {
            local_80.line._6_2_ = 2;
            local_80.line._0_4_ = 0x17;
            Position::operator+((Position *)
                                ((long)(((puVar1->_M_t).
                                         super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
                                         .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>.
                                        _M_head_impl)->id)._M_t + 0x20),
                                (Position *)
                                ((long)((puVar2[-1]._M_t.
                                         super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
                                         .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>.
                                        _M_head_impl)->expr)._M_t.
                                       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                + 0x20));
            std::
            make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position>
                      ((Level *)local_90,(SyntaxErrorCode *)((long)&local_80.line + 6),&local_80);
            generateError((Parser *)local_68,
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr(local_68);
            std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)local_90);
          }
          if (*(long *)((long)funcExpr._M_t.
                              super___uniq_ptr_impl<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pfederc::FuncExpr_*,_std::default_delete<pfederc::FuncExpr>_>
                              .super__Head_base<0UL,_pfederc::FuncExpr_*,_false>._M_head_impl + 0x80
                       ) != 0) {
            local_80.line._0_4_ = CONCAT22(local_80.line._2_2_,2);
            local_90._0_4_ = STX_ERR_TRAIT_SCOPE_FUNC_BODY;
            std::
            make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                      ((Level *)local_48,(SyntaxErrorCode *)&local_80,(Position *)local_90);
            generateError((Parser *)(local_68 + 3),
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr(local_68 + 3);
            std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::~unique_ptr(local_48);
          }
          std::__cxx11::
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          ::push_back((list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                       *)local_80.endIndex,&funcExpr);
          std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                    (&funcExpr);
        }
        else {
          local_90._0_2_ = 2;
          funcExpr._M_t.
          super___uniq_ptr_impl<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::FuncExpr_*,_std::default_delete<pfederc::FuncExpr>_>.
          super__Head_base<0UL,_pfederc::FuncExpr_*,_false>._M_head_impl._0_4_ = 0x16;
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                    ((Level *)local_48,(SyntaxErrorCode *)local_90,(Position *)&funcExpr);
          generateError((Parser *)(local_68 + 2),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    (local_68 + 2);
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr(local_48);
        }
      }
      bVar4 = expect(this,TOK_EOL);
      if (!bVar4) {
        local_90._0_2_ = 2;
        funcExpr._M_t.
        super___uniq_ptr_impl<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::FuncExpr_*,_std::default_delete<pfederc::FuncExpr>_>.
        super__Head_base<0UL,_pfederc::FuncExpr_*,_false>._M_head_impl._0_4_ = 0xf;
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)local_48,(SyntaxErrorCode *)local_90,(Position *)&funcExpr);
        generateError((Parser *)(local_68 + 1),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  (local_68 + 1);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr(local_48);
        skipToStmtEol(this);
      }
      if ((FuncExpr *)local_80.startIndex != (FuncExpr *)0x0) {
        (**(code **)(*(long *)local_80.startIndex + 8))();
      }
    }
  }
  return;
}

Assistant:

void Parser::parseTraitBody(bool &err,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      std::unique_ptr<FuncExpr> funcExpr(
            dynamic_cast<FuncExpr*>(expr.release()));

      if (!funcExpr->getTemplates().empty()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_TEMPL,
              funcExpr->getTemplates().front()->id->getPosition()
              + funcExpr->getTemplates().back()->expr->getPosition()));
      }

      if (funcExpr->getBody()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_BODY,
              funcExpr->getBody()->getPosition()));
      }

      functions.push_back(std::move(funcExpr));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR, 
            SyntaxErrorCode::STX_ERR_TRAIT_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
}